

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O1

bool __thiscall soinn::ESOINN::needMergeClasses(ESOINN *this,Vertex *a,Vertex *b)

{
  StoredVertexList *pSVar1;
  double dVar2;
  int iVar3;
  Vertex pvVar4;
  _List_node_base *p_Var5;
  Vertex pvVar6;
  VertexIterator end;
  _List_node_base *p_Var7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  uint uVar12;
  
  pvVar4 = *a;
  iVar3 = *(int *)((long)pvVar4 + 0x38);
  dVar8 = meanDensity(this,iVar3);
  pSVar1 = &(this->graph).super_type.m_vertices;
  dVar10 = 2.2250738585072014e-308;
  p_Var7 = (this->graph).super_type.m_vertices.super__List_base<void_*,_std::allocator<void_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  for (p_Var5 = p_Var7; p_Var5 != (_List_node_base *)pSVar1; p_Var5 = p_Var5->_M_next) {
    dVar9 = (double)p_Var5[1]._M_next[4]._M_next;
    if ((dVar10 < dVar9) && (*(int *)((long)(p_Var5[1]._M_next + 3) + 8) == iVar3)) {
      dVar10 = dVar9;
    }
  }
  uVar12 = 0;
  if (dVar8 + dVar8 < dVar10) {
    if ((dVar8 * 3.0 < dVar10) || (dVar10 <= dVar8 + dVar8)) {
      uVar12 = 0x3ff00000;
    }
    else {
      uVar12 = 0x3fe00000;
    }
  }
  pvVar6 = *b;
  iVar3 = *(int *)((long)pvVar6 + 0x38);
  dVar9 = meanDensity(this,iVar3);
  dVar8 = 2.2250738585072014e-308;
  for (; p_Var7 != (_List_node_base *)pSVar1; p_Var7 = p_Var7->_M_next) {
    dVar11 = (double)p_Var7[1]._M_next[4]._M_next;
    if ((dVar8 < dVar11) && (*(int *)((long)(p_Var7[1]._M_next + 3) + 8) == iVar3)) {
      dVar8 = dVar11;
    }
  }
  dVar11 = 0.0;
  if (dVar9 + dVar9 < dVar8) {
    if ((dVar9 * 3.0 < dVar8) || (dVar8 <= dVar9 + dVar9)) {
      dVar11 = 1.0;
    }
    else {
      dVar11 = 0.5;
    }
  }
  dVar9 = *(double *)((long)pvVar6 + 0x40);
  dVar2 = *(double *)((long)pvVar4 + 0x40);
  if (dVar2 <= dVar9) {
    dVar9 = dVar2;
  }
  return (bool)(-(dVar10 * (double)((ulong)uVar12 << 0x20) < dVar9) & -(dVar8 * dVar11 < dVar9) & 1)
  ;
}

Assistant:

bool ESOINN::needMergeClasses(Vertex &a, Vertex &b)
{
    int A = graph[a].classId;
    double meanA = meanDensity(A);
    double maxA = maxDensity(A);
    double thresholdA = densityThershold(meanA, maxA);
    int B = graph[b].classId;
    double meanB = meanDensity(B);
    double maxB = maxDensity(B);
    double thresholdB = densityThershold(meanB, maxB);
    double minAB = std::min(graph[a].density, graph[b].density);
    if(minAB > thresholdA * maxA && minAB > thresholdB * maxB)
    {
        return true;
    }
    return false;
}